

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_process(mbedtls_md_context_t *ctx,uchar *data)

{
  uchar *data_local;
  mbedtls_md_context_t *ctx_local;
  
  if ((ctx == (mbedtls_md_context_t *)0x0) || (ctx->md_info == (mbedtls_md_info_t *)0x0)) {
    ctx_local._4_4_ = -0x5100;
  }
  else {
    switch(ctx->md_info->type) {
    case MBEDTLS_MD_MD5:
      ctx_local._4_4_ = mbedtls_internal_md5_process((mbedtls_md5_context *)ctx->md_ctx,data);
      break;
    case MBEDTLS_MD_SHA1:
      ctx_local._4_4_ = mbedtls_internal_sha1_process((mbedtls_sha1_context *)ctx->md_ctx,data);
      break;
    case MBEDTLS_MD_SHA224:
      ctx_local._4_4_ = mbedtls_internal_sha256_process((mbedtls_sha256_context *)ctx->md_ctx,data);
      break;
    case MBEDTLS_MD_SHA256:
      ctx_local._4_4_ = mbedtls_internal_sha256_process((mbedtls_sha256_context *)ctx->md_ctx,data);
      break;
    case MBEDTLS_MD_SHA384:
      ctx_local._4_4_ = mbedtls_internal_sha512_process((mbedtls_sha512_context *)ctx->md_ctx,data);
      break;
    case MBEDTLS_MD_SHA512:
      ctx_local._4_4_ = mbedtls_internal_sha512_process((mbedtls_sha512_context *)ctx->md_ctx,data);
      break;
    case MBEDTLS_MD_RIPEMD160:
      ctx_local._4_4_ =
           mbedtls_internal_ripemd160_process((mbedtls_ripemd160_context *)ctx->md_ctx,data);
      break;
    default:
      ctx_local._4_4_ = -0x5100;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_md_process( mbedtls_md_context_t *ctx, const unsigned char *data )
{
    if( ctx == NULL || ctx->md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    switch( ctx->md_info->type )
    {
#if defined(MBEDTLS_MD2_C)
        case MBEDTLS_MD_MD2:
            return( mbedtls_internal_md2_process( ctx->md_ctx ) );
#endif
#if defined(MBEDTLS_MD4_C)
        case MBEDTLS_MD_MD4:
            return( mbedtls_internal_md4_process( ctx->md_ctx, data ) );
#endif
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_MD_MD5:
            return( mbedtls_internal_md5_process( ctx->md_ctx, data ) );
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case MBEDTLS_MD_RIPEMD160:
            return( mbedtls_internal_ripemd160_process( ctx->md_ctx, data ) );
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_MD_SHA1:
            return( mbedtls_internal_sha1_process( ctx->md_ctx, data ) );
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_MD_SHA224:
            return( mbedtls_internal_sha256_process( ctx->md_ctx, data ) );
        case MBEDTLS_MD_SHA256:
            return( mbedtls_internal_sha256_process( ctx->md_ctx, data ) );
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case MBEDTLS_MD_SHA384:
            return( mbedtls_internal_sha512_process( ctx->md_ctx, data ) );
#endif
        case MBEDTLS_MD_SHA512:
            return( mbedtls_internal_sha512_process( ctx->md_ctx, data ) );
#endif
        default:
            return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );
    }
}